

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

void __thiscall Cleaner::Remove(Cleaner *this,string *path)

{
  bool bVar1;
  int iVar2;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  
  bVar1 = IsAlreadyRemoved(this,path);
  if (!bVar1) {
    pVar3 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->removed_,path);
    if (this->config_[4] == (BuildConfig)0x1) {
      bVar1 = FileExists(this,path);
      if (bVar1) {
LAB_0010bfaf:
        Report(this,path);
        return;
      }
    }
    else {
      iVar2 = (**(code **)(*(long *)this->disk_interface_ + 0x30))
                        (this->disk_interface_,path,pVar3._8_8_);
      if (iVar2 == -1) {
        this->status_ = 1;
      }
      else if (iVar2 == 0) goto LAB_0010bfaf;
    }
  }
  return;
}

Assistant:

void Cleaner::Remove(const string& path) {
  if (!IsAlreadyRemoved(path)) {
    removed_.insert(path);
    if (config_.dry_run) {
      if (FileExists(path))
        Report(path);
    } else {
      int ret = RemoveFile(path);
      if (ret == 0)
        Report(path);
      else if (ret == -1)
        status_ = 1;
    }
  }
}